

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O0

void __thiscall
TPZCreateApproximationSpace::BuildMesh(TPZCreateApproximationSpace *this,TPZCompMesh *cmesh)

{
  bool bVar1;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *__x;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *this_00;
  TPZCompMesh *in_RSI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar2;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> materialids;
  TPZCompMesh *in_stack_000000a8;
  TPZCreateApproximationSpace *in_stack_000000b0;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff60;
  _Self in_stack_ffffffffffffff80;
  _Self local_68 [3];
  _Base_ptr local_50;
  _Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> local_48 [7];
  TPZCompMesh *local_10;
  
  local_10 = in_RSI;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ba9a2e);
  std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::_Rb_tree_iterator(local_48);
  __x = TPZCompMesh::MaterialVec(local_10);
  local_50 = (_Base_ptr)
             std::
             map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
             ::begin((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_48[0]._M_node = local_50;
  while( true ) {
    this_00 = TPZCompMesh::MaterialVec(local_10);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::end((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    bVar1 = std::operator!=(local_48,local_68);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
               in_stack_ffffffffffffff60._M_node);
    pVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       in_stack_ffffffffffffff80._M_node,(value_type_conflict4 *)__x);
    in_stack_ffffffffffffff60 = pVar2.first._M_node;
    in_stack_ffffffffffffff5f = pVar2.second;
    in_stack_ffffffffffffff80 =
         std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator++
                   ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)this_00,
                    pVar2.first._M_node._4_4_);
  }
  BuildMesh(in_stack_000000b0,in_stack_000000a8,
            (set<int,_std::less<int>,_std::allocator<int>_> *)this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ba9b21);
  return;
}

Assistant:

void TPZCreateApproximationSpace::BuildMesh(TPZCompMesh &cmesh) const {
    std::set<int> materialids;
    std::map<int,TPZMaterial *>::iterator it;
    for (it = cmesh.MaterialVec().begin(); it != cmesh.MaterialVec().end(); it++) {
        materialids.insert(it->first);
    }
    BuildMesh(cmesh,materialids);
}